

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int> *map,Var *max)

{
  uint uVar1;
  bool bVar2;
  Var VVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  bVar2 = satisfied(this,c);
  if (bVar2) {
    return;
  }
  lVar4 = *(long *)&c->header;
  if (0 < (int)((ulong)lVar4 >> 0x20)) {
    lVar6 = 0;
    do {
      uVar1 = *(uint *)(&c[1].header.field_0x0 + lVar6 * 4);
      if (((byte)uVar1 & 1 ^ (this->assigns).data[(int)uVar1 >> 1].value) != 1) {
        pcVar5 = "-";
        if ((uVar1 & 1) == 0) {
          pcVar5 = "";
        }
        VVar3 = mapVar((int)uVar1 >> 1,map,max);
        fprintf((FILE *)f,"%s%d ",pcVar5,(ulong)(VVar3 + 1));
        lVar4 = *(long *)&c->header;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar4 >> 0x20);
  }
  fwrite("0\n",2,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, Clause &c, vec <Var> &map, Var &max) {
    if(satisfied(c)) return;

    for(int i = 0; i < c.size(); i++)
        if(value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max) + 1);
    fprintf(f, "0\n");
}